

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solvers.cpp
# Opt level: O1

vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
* getPredefinedTransformations2Plane1Line<double>
            (vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
             *__return_storage_ptr__,Matrix<double,_4,_1,_0,_4,_1> *Pi1,
            Matrix<double,_4,_1,_0,_4,_1> *Pi2,Matrix<double,_4,_1,_0,_4,_1> *Nu1,
            Matrix<double,_4,_1,_0,_4,_1> *Nu2,bool verbose)

{
  iterator iVar1;
  undefined8 uVar2;
  CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *pCVar3;
  CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *pCVar4;
  long lVar5;
  ostream *poVar6;
  undefined8 *puVar7;
  char *__function;
  Matrix<double,_4,_4,_0,_4,_4> *pMVar8;
  iterator iVar9;
  undefined3 in_register_00000089;
  byte bVar10;
  undefined4 uVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  Matrix<double,_3,_1,_0,_3,_1> auxT;
  Matrix<double,_4,_4,_0,_4,_4> auxTrans;
  Matrix<double,_3,_3,_0,_3,_3> auxRot;
  CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> local_318;
  undefined1 local_2f8 [16];
  undefined4 local_2dc;
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [16];
  double local_2b8;
  ulong uStack_2b0;
  double local_2a0;
  double local_298;
  ulong uStack_290;
  double local_288;
  double local_280;
  double local_278;
  ulong uStack_270;
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  double local_248;
  ulong uStack_240;
  undefined1 local_238 [16];
  double local_228;
  double local_220;
  double local_218;
  ulong uStack_210;
  undefined1 local_208 [16];
  double local_1f8;
  ulong uStack_1f0;
  undefined1 local_1e8 [16];
  double local_1d8;
  ulong uStack_1d0;
  double local_1c0;
  double local_1b8;
  double local_1b0;
  double local_1a8;
  ulong uStack_1a0;
  double local_198;
  double dStack_190;
  double local_188;
  double local_178;
  ulong uStack_170;
  double local_168;
  double local_160;
  double local_158;
  double local_150;
  double local_148;
  double local_140;
  double local_138;
  double local_130;
  double local_128;
  undefined8 uStack_120;
  double local_118;
  undefined8 uStack_110;
  double local_108 [2];
  Matrix<double,_4,_4,_0,_4,_4> local_f8;
  double local_78 [2];
  undefined8 local_68 [7];
  
  local_2dc = CONCAT31(in_register_00000089,verbose);
  bVar10 = 0;
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_268._0_8_ =
       (Pi1->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.array[0]
  ;
  local_1f8 = (Pi1->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.
              array[1];
  local_108[0] = (Pi1->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.
                 m_data.array[2];
  dVar12 = (Pi2->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.
           array[0];
  local_278 = (Pi2->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.
              array[1];
  local_248 = (Pi2->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.
              array[2];
  local_118 = local_108[0] * local_108[0];
  local_128 = local_1f8 * local_1f8;
  local_2d8._0_8_ = local_128 + local_118;
  local_258._8_8_ = local_258._0_8_;
  local_258._0_8_ = dVar12;
  local_1e8._0_8_ = local_268._0_8_ ^ (ulong)DAT_0022b0c0;
  uStack_2b0 = DAT_0022b0c0._8_8_;
  local_208._0_8_ = local_1f8 * (double)local_1e8._0_8_;
  local_208._8_8_ = 0;
  local_1e8._0_8_ = (double)local_1e8._0_8_ * local_108[0];
  local_1e8._8_8_ = uStack_2b0;
  local_238._0_8_ =
       (double)local_1e8._0_8_ * local_248 +
       (double)local_208._0_8_ * local_278 + local_128 * dVar12 + local_118 * dVar12;
  local_238._8_8_ = uStack_2b0;
  uStack_1f0 = 0;
  dVar14 = local_1f8 * local_248 - local_278 * local_108[0];
  local_268._8_8_ = 0;
  local_298 = (double)local_268._0_8_ * (double)local_268._0_8_;
  uStack_290 = 0;
  uStack_120 = 0;
  uStack_110 = 0;
  local_2f8._0_8_ = local_298 + local_128 + local_118;
  local_2f8._8_8_ = 0;
  local_2d8._8_8_ = 0;
  local_2b8 = (double)local_238._0_8_ * (double)local_238._0_8_ * (double)local_2d8._0_8_ +
              dVar14 * dVar14 * (double)local_2d8._0_8_ * (double)local_2f8._0_8_;
  local_108[1] = 0.0;
  local_2c8._8_4_ = DAT_0022b0c0._8_4_;
  local_2c8._0_8_ = (ulong)local_108[0] ^ (ulong)DAT_0022b0c0;
  local_2c8._12_4_ = DAT_0022b0c0._12_4_;
  local_1b0 = (Pi1->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.
              array[3];
  local_160 = (Pi2->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.
              array[3];
  local_1d8 = (Nu1->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.
              array[0];
  uStack_1d0 = 0;
  local_1a8 = (Nu1->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.
              array[1];
  uStack_1a0 = 0;
  local_178 = (Nu1->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.
              array[2];
  uStack_170 = 0;
  local_1b8 = (Nu1->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.
              array[3];
  local_2a0 = (Nu2->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.
              array[0];
  local_288 = (Nu2->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.
              array[1];
  local_280 = (Nu2->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.
              array[2];
  local_1c0 = (Nu2->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.
              array[3];
  dVar12 = SQRT(local_2b8);
  dVar13 = dVar12;
  if (local_2b8 < 0.0) {
    uStack_210 = 0;
    local_218 = dVar14;
    local_168 = dVar12;
    dVar12 = sqrt(local_2b8);
    dVar13 = local_168;
    dVar14 = local_218;
  }
  local_78[0] = dVar14 * (1.0 / dVar12) * (double)local_2d8._0_8_;
  local_318.m_row = 0;
  local_318.m_col = 1;
  local_318.m_currentBlockRows = 1;
  local_318.m_xpr = (Matrix<double,_3,_3,_0,_3,_3> *)local_78;
  if (local_2b8 < 0.0) {
    dVar13 = sqrt(local_2b8);
  }
  local_220 = ((double)local_268._0_8_ * local_248 +
              (double)local_258._0_8_ * (double)local_2c8._0_8_) * (-1.0 / dVar13) *
              (double)local_2d8._0_8_;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                     (&local_318,&local_220);
  if (local_2b8 < 0.0) {
    dVar12 = sqrt(local_2b8);
  }
  else {
    dVar12 = SQRT(local_2b8);
  }
  local_228 = ((double)local_268._0_8_ * local_278 - (double)local_258._0_8_ * local_1f8) *
              (1.0 / dVar12) * (double)local_2d8._0_8_;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar3,&local_228);
  if (local_2b8 < 0.0) {
    dVar12 = sqrt(local_2b8);
  }
  else {
    dVar12 = SQRT(local_2b8);
  }
  dVar12 = (-1.0 / dVar12) * (double)local_2d8._0_8_;
  if ((double)local_2f8._0_8_ < 0.0) {
    local_218 = dVar12;
    dVar13 = sqrt((double)local_2f8._0_8_);
    dVar12 = local_218;
  }
  else {
    dVar13 = SQRT((double)local_2f8._0_8_);
  }
  local_130 = (double)local_238._0_8_ * (dVar12 / dVar13);
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar3,&local_130);
  if (local_2b8 < 0.0) {
    dVar12 = sqrt(local_2b8);
  }
  else {
    dVar12 = SQRT(local_2b8);
  }
  local_218 = -local_1f8;
  uStack_210 = uStack_1f0 ^ 0x8000000000000000;
  local_238._0_8_ = (-1.0 / dVar12) * (double)local_2d8._0_8_;
  if ((double)local_2f8._0_8_ < 0.0) {
    local_138 = sqrt((double)local_2f8._0_8_);
  }
  else {
    local_138 = SQRT((double)local_2f8._0_8_);
  }
  local_138 = (double)local_238._0_8_ / local_138;
  uVar11 = local_208._12_4_;
  dVar12 = local_208._0_8_ * (double)local_258._0_8_;
  local_208._8_4_ = local_208._8_4_;
  local_208._0_8_ = dVar12;
  local_208._12_4_ = uVar11;
  local_238._8_4_ = SUB84(local_108[1],0);
  local_238._0_8_ = local_108[0] * local_218;
  local_238._12_4_ = (int)((ulong)local_108[1] >> 0x20);
  local_138 = (local_108[0] * local_218 * local_248 +
              local_298 * local_278 + local_118 * local_278 + dVar12) * local_138;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar3,&local_138);
  if (local_2b8 < 0.0) {
    dVar12 = sqrt(local_2b8);
  }
  else {
    dVar12 = SQRT(local_2b8);
  }
  uVar11 = local_2d8._12_4_;
  local_2d8._8_4_ = local_2d8._8_4_;
  local_2d8._0_8_ = local_2d8._0_8_ * (-1.0 / dVar12);
  local_2d8._12_4_ = uVar11;
  if ((double)local_2f8._0_8_ < 0.0) {
    dVar12 = sqrt((double)local_2f8._0_8_);
  }
  else {
    dVar12 = SQRT((double)local_2f8._0_8_);
  }
  uVar11 = local_1e8._12_4_;
  dVar13 = local_1e8._0_8_ * (double)local_258._0_8_;
  local_1e8._8_4_ = local_1e8._8_4_;
  local_1e8._0_8_ = dVar13;
  local_1e8._12_4_ = uVar11;
  uVar11 = local_238._12_4_;
  dVar14 = local_238._0_8_ * local_278;
  local_238._8_4_ = local_238._8_4_;
  local_238._0_8_ = dVar14;
  local_238._12_4_ = uVar11;
  local_140 = (local_298 * local_248 + local_128 * local_248 + dVar13 + dVar14) *
              ((double)local_2d8._0_8_ / dVar12);
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar3,&local_140);
  if ((double)local_2f8._0_8_ < 0.0) {
    local_148 = sqrt((double)local_2f8._0_8_);
  }
  else {
    local_148 = SQRT((double)local_2f8._0_8_);
  }
  local_148 = (double)local_268._0_8_ / local_148;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar3,&local_148);
  if ((double)local_2f8._0_8_ < 0.0) {
    local_150 = sqrt((double)local_2f8._0_8_);
  }
  else {
    local_150 = SQRT((double)local_2f8._0_8_);
  }
  local_150 = local_1f8 / local_150;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar3,&local_150);
  if ((double)local_2f8._0_8_ < 0.0) {
    local_158 = sqrt((double)local_2f8._0_8_);
  }
  else {
    local_158 = SQRT((double)local_2f8._0_8_);
  }
  local_158 = local_108[0] / local_158;
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_(pCVar3,&local_158);
  if (((DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)
       (local_318.m_row + local_318.m_currentBlockRows) ==
       (DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)0x3) && (local_318.m_col == 3)) {
    local_318.m_xpr = (Matrix<double,_3,_3,_0,_3,_3> *)&local_198;
    local_318.m_row = 0;
    local_318.m_col = 1;
    local_318.m_currentBlockRows = 1;
    local_198 = 0.0;
    if ((double)local_2f8._0_8_ < 0.0) {
      dVar12 = sqrt((double)local_2f8._0_8_);
    }
    else {
      dVar12 = SQRT((double)local_2f8._0_8_);
    }
    uVar11 = local_2c8._12_4_;
    local_2c8._8_4_ = local_2c8._8_4_;
    local_2c8._0_8_ =
         (local_2c8._0_8_ * local_1b0 * local_248 +
         local_218 * local_1b0 * local_278 +
         ((local_160 * local_118 + local_298 * local_160 + local_128 * local_160) -
         (double)local_268._0_8_ * local_1b0 * (double)local_258._0_8_)) * (-1.0 / dVar12);
    local_2c8._12_4_ = uVar11;
    dVar12 = (double)local_238._0_8_ * local_248 + (double)local_238._0_8_ * local_248 +
             (double)local_1e8._0_8_ * local_248 + (double)local_1e8._0_8_ * local_248 +
             (double)local_208._0_8_ * local_278 + (double)local_208._0_8_ * local_278 +
             local_278 * local_278 * local_118 +
             local_248 * local_248 * local_128 +
             (double)local_258._0_8_ * (double)local_258._0_8_ * local_118 +
             local_298 * local_248 * local_248 +
             local_298 * local_278 * local_278 +
             local_128 * (double)local_258._0_8_ * (double)local_258._0_8_;
    if (dVar12 < 0.0) {
      dVar12 = sqrt(dVar12);
    }
    else {
      dVar12 = SQRT(dVar12);
    }
    local_220 = (double)local_2c8._0_8_ / dVar12;
    pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
                       ((CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_318,
                        &local_220);
    if ((double)local_2f8._0_8_ < 0.0) {
      local_228 = sqrt((double)local_2f8._0_8_);
    }
    else {
      local_228 = SQRT((double)local_2f8._0_8_);
    }
    local_228 = local_1b0 / local_228;
    Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_(pCVar4,&local_228);
    if (((DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)
         (local_318.m_row + local_318.m_currentBlockRows) ==
         (DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)0x3) && (local_318.m_col == 1)) {
      local_f8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [0] = 1.0;
      local_f8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [1] = 0.0;
      local_f8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [2] = 0.0;
      local_f8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [3] = 0.0;
      local_f8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [4] = 0.0;
      local_f8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [5] = 1.0;
      local_f8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [6] = 0.0;
      local_f8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [7] = 0.0;
      local_f8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [8] = 0.0;
      local_f8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [9] = 0.0;
      local_f8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [10] = 1.0;
      local_f8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [0xb] = 0.0;
      local_f8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [0xc] = 0.0;
      local_f8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [0xd] = 0.0;
      local_f8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [0xe] = 0.0;
      local_f8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [0xf] = 1.0;
      lVar5 = 0x10;
      puVar7 = local_68;
      do {
        uVar2 = puVar7[-1];
        *(undefined8 *)((long)local_108 + lVar5) = puVar7[-2];
        *(undefined8 *)
         ((long)local_f8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                m_data.array + lVar5 + -8) = uVar2;
        *(undefined8 *)
         ((long)local_f8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                m_data.array + lVar5) = *puVar7;
        puVar7 = puVar7 + 3;
        lVar5 = lVar5 + 0x20;
      } while (lVar5 != 0x70);
      local_f8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [0xc] = local_198;
      local_f8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [0xd] = dStack_190;
      local_f8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [0xe] = local_188;
      if ((char)local_2dc != '\0') {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"[VERBOSE] Matrix [U,u;0,0,0,1]",0x1e);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
        std::ostream::put('x');
        poVar6 = (ostream *)std::ostream::flush();
        poVar6 = Eigen::operator<<(poVar6,(DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)
                                          &local_f8);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
        std::ostream::put((char)poVar6);
        std::ostream::flush();
        if ((char)local_2dc != '\0') {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"[VERBOSE] inv(T)*T = eye(3)",0x1b);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
          std::ostream::put('x');
          poVar6 = (ostream *)std::ostream::flush();
          local_318.m_xpr = (Matrix<double,_3,_3,_0,_3,_3> *)&local_f8;
          local_318.m_row = (Index)&local_f8;
          poVar6 = Eigen::operator<<(poVar6,(DenseBase<Eigen::Product<Eigen::Inverse<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>_>
                                             *)&local_318);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
          std::ostream::put((char)poVar6);
          std::ostream::flush();
        }
      }
      iVar1._M_current =
           (__return_storage_ptr__->
           super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      if (iVar1._M_current ==
          (__return_storage_ptr__->
          super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<Eigen::Matrix<double,4,4,0,4,4>,std::allocator<Eigen::Matrix<double,4,4,0,4,4>>>
        ::_M_realloc_insert<Eigen::Matrix<double,4,4,0,4,4>const&>
                  ((vector<Eigen::Matrix<double,4,4,0,4,4>,std::allocator<Eigen::Matrix<double,4,4,0,4,4>>>
                    *)__return_storage_ptr__,iVar1,&local_f8);
      }
      else {
        pMVar8 = &local_f8;
        iVar9._M_current = iVar1._M_current;
        for (lVar5 = 0x10; lVar5 != 0; lVar5 = lVar5 + -1) {
          ((iVar9._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).
          m_storage.m_data.array[0] =
               (pMVar8->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
               m_data.array[0];
          pMVar8 = (Matrix<double,_4,_4,_0,_4,_4> *)((long)pMVar8 + ((ulong)bVar10 * -2 + 1) * 8);
          iVar9._M_current =
               (Matrix<double,_4,_4,_0,_4,_4> *)
               ((long)iVar9._M_current + ((ulong)bVar10 * -2 + 1) * 8);
        }
        (__return_storage_ptr__->
        super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
        )._M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
      }
      local_1f8 = local_178 * local_178;
      local_208._0_8_ = local_1a8 * local_1a8;
      local_2d8._0_8_ = (double)local_208._0_8_ + local_1f8;
      uStack_2b0 = uStack_1d0 ^ 0x8000000000000000;
      dVar12 = local_1a8 * -local_1d8;
      local_268._8_4_ = (int)uStack_1a0;
      local_268._0_8_ = dVar12;
      local_268._12_4_ = (int)(uStack_1a0 >> 0x20);
      local_278 = -local_1d8 * local_178;
      local_2c8._0_8_ =
           local_278 * local_280 +
           dVar12 * local_288 + (double)local_208._0_8_ * local_2a0 + local_1f8 * local_2a0;
      local_2c8._8_8_ = uStack_2b0;
      local_258._8_4_ = (int)uStack_170;
      local_258._0_8_ = -local_178;
      local_258._12_4_ = (uint)(uStack_170 >> 0x20) ^ 0x80000000;
      dVar14 = local_1a8 * local_280 - local_288 * local_178;
      local_248 = local_1d8 * local_1d8;
      uStack_240 = uStack_1d0;
      local_208._8_8_ = uStack_1a0;
      uStack_1f0 = uStack_170;
      dVar12 = local_248 + (double)local_208._0_8_ + local_1f8;
      local_2f8._8_4_ = (int)uStack_1d0;
      local_2f8._0_8_ = dVar12;
      local_2f8._12_4_ = (int)(uStack_1d0 >> 0x20);
      local_2d8._8_8_ = uStack_1a0;
      local_2b8 = (double)local_2c8._0_8_ * (double)local_2c8._0_8_ * (double)local_2d8._0_8_ +
                  dVar14 * dVar14 * (double)local_2d8._0_8_ * dVar12;
      dVar12 = SQRT(local_2b8);
      dVar13 = dVar12;
      uStack_270 = uStack_2b0;
      if (local_2b8 < 0.0) {
        uStack_290 = uStack_1a0;
        local_1e8._0_8_ = dVar12;
        local_298 = dVar14;
        dVar12 = sqrt(local_2b8);
        dVar14 = local_298;
        dVar13 = (double)local_1e8._0_8_;
      }
      local_78[0] = dVar14 * (1.0 / dVar12) * (double)local_2d8._0_8_;
      local_318.m_row = 0;
      local_318.m_col = 1;
      local_318.m_currentBlockRows = 1;
      local_318.m_xpr = (Matrix<double,_3,_3,_0,_3,_3> *)local_78;
      if (local_2b8 < 0.0) {
        dVar13 = sqrt(local_2b8);
      }
      local_220 = (local_1d8 * local_280 + local_2a0 * (double)local_258._0_8_) * (-1.0 / dVar13) *
                  (double)local_2d8._0_8_;
      pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                         (&local_318,&local_220);
      if (local_2b8 < 0.0) {
        dVar12 = sqrt(local_2b8);
      }
      else {
        dVar12 = SQRT(local_2b8);
      }
      local_228 = (local_1d8 * local_288 - local_2a0 * local_1a8) * (1.0 / dVar12) *
                  (double)local_2d8._0_8_;
      pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                         (pCVar3,&local_228);
      if (local_2b8 < 0.0) {
        dVar12 = sqrt(local_2b8);
      }
      else {
        dVar12 = SQRT(local_2b8);
      }
      dVar12 = (-1.0 / dVar12) * (double)local_2d8._0_8_;
      if ((double)local_2f8._0_8_ < 0.0) {
        local_298 = dVar12;
        dVar13 = sqrt((double)local_2f8._0_8_);
        dVar12 = local_298;
      }
      else {
        dVar13 = SQRT((double)local_2f8._0_8_);
      }
      local_130 = (double)local_2c8._0_8_ * (dVar12 / dVar13);
      pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                         (pCVar3,&local_130);
      if (local_2b8 < 0.0) {
        dVar12 = sqrt(local_2b8);
      }
      else {
        dVar12 = SQRT(local_2b8);
      }
      local_298 = -local_1a8;
      uStack_290 = uStack_1a0 ^ 0x8000000000000000;
      local_2c8._0_8_ = (-1.0 / dVar12) * (double)local_2d8._0_8_;
      if ((double)local_2f8._0_8_ < 0.0) {
        local_138 = sqrt((double)local_2f8._0_8_);
      }
      else {
        local_138 = SQRT((double)local_2f8._0_8_);
      }
      local_138 = (double)local_2c8._0_8_ / local_138;
      local_268._0_8_ = (double)local_268._0_8_ * local_2a0;
      local_2c8._8_4_ = (int)uStack_170;
      local_2c8._0_8_ = local_178 * local_298;
      local_2c8._12_4_ = (int)(uStack_170 >> 0x20);
      local_138 = (local_178 * local_298 * local_280 +
                  local_248 * local_288 + local_1f8 * local_288 + (double)local_268._0_8_) *
                  local_138;
      pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                         (pCVar3,&local_138);
      if (local_2b8 < 0.0) {
        dVar12 = sqrt(local_2b8);
      }
      else {
        dVar12 = SQRT(local_2b8);
      }
      uVar11 = local_2d8._12_4_;
      local_2d8._8_4_ = local_2d8._8_4_;
      local_2d8._0_8_ = local_2d8._0_8_ * (-1.0 / dVar12);
      local_2d8._12_4_ = uVar11;
      if ((double)local_2f8._0_8_ < 0.0) {
        dVar12 = sqrt((double)local_2f8._0_8_);
      }
      else {
        dVar12 = SQRT((double)local_2f8._0_8_);
      }
      local_278 = local_278 * local_2a0;
      local_2c8._0_8_ = (double)local_2c8._0_8_ * local_288;
      local_140 = (local_248 * local_280 + (double)local_208._0_8_ * local_280 + local_278 +
                  (double)local_2c8._0_8_) * ((double)local_2d8._0_8_ / dVar12);
      pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                         (pCVar3,&local_140);
      if ((double)local_2f8._0_8_ < 0.0) {
        local_148 = sqrt((double)local_2f8._0_8_);
      }
      else {
        local_148 = SQRT((double)local_2f8._0_8_);
      }
      local_148 = local_1d8 / local_148;
      pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                         (pCVar3,&local_148);
      if ((double)local_2f8._0_8_ < 0.0) {
        local_150 = sqrt((double)local_2f8._0_8_);
      }
      else {
        local_150 = SQRT((double)local_2f8._0_8_);
      }
      local_150 = local_1a8 / local_150;
      pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                         (pCVar3,&local_150);
      if ((double)local_2f8._0_8_ < 0.0) {
        local_158 = sqrt((double)local_2f8._0_8_);
      }
      else {
        local_158 = SQRT((double)local_2f8._0_8_);
      }
      local_158 = local_178 / local_158;
      Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_(pCVar3,&local_158);
      if (((DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)
           (local_318.m_row + local_318.m_currentBlockRows) !=
           (DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)0x3) || (local_318.m_col != 3))
      goto LAB_0014b3f6;
      local_318.m_xpr = (Matrix<double,_3,_3,_0,_3,_3> *)&local_198;
      local_318.m_row = 0;
      local_318.m_col = 1;
      local_318.m_currentBlockRows = 1;
      local_198 = 0.0;
      if ((double)local_2f8._0_8_ < 0.0) {
        dVar12 = sqrt((double)local_2f8._0_8_);
      }
      else {
        dVar12 = SQRT((double)local_2f8._0_8_);
      }
      uVar11 = local_258._12_4_;
      local_258._8_4_ = local_258._8_4_;
      local_258._0_8_ =
           (local_258._0_8_ * local_1b8 * local_280 +
           local_298 * local_1b8 * local_288 +
           ((local_1c0 * local_1f8 + local_248 * local_1c0 + (double)local_208._0_8_ * local_1c0) -
           local_1d8 * local_1b8 * local_2a0)) * (-1.0 / dVar12);
      local_258._12_4_ = uVar11;
      dVar12 = (double)local_2c8._0_8_ * local_280 + (double)local_2c8._0_8_ * local_280 +
               local_278 * local_280 + local_278 * local_280 +
               (double)local_268._0_8_ * local_288 + (double)local_268._0_8_ * local_288 +
               local_288 * local_288 * local_1f8 +
               local_280 * local_280 * (double)local_208._0_8_ +
               local_2a0 * local_2a0 * local_1f8 +
               local_248 * local_280 * local_280 +
               local_248 * local_288 * local_288 + (double)local_208._0_8_ * local_2a0 * local_2a0;
      if (dVar12 < 0.0) {
        dVar12 = sqrt(dVar12);
      }
      else {
        dVar12 = SQRT(dVar12);
      }
      local_220 = (double)local_258._0_8_ / dVar12;
      pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
                         ((CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_318,
                          &local_220);
      if ((double)local_2f8._0_8_ < 0.0) {
        local_228 = sqrt((double)local_2f8._0_8_);
      }
      else {
        local_228 = SQRT((double)local_2f8._0_8_);
      }
      local_228 = local_1b8 / local_228;
      Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_(pCVar4,&local_228);
      if (((DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)
           (local_318.m_row + local_318.m_currentBlockRows) ==
           (DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)0x3) && (local_318.m_col == 1)) {
        local_f8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
        [0] = 1.0;
        local_f8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
        [3] = 0.0;
        local_f8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
        [4] = 0.0;
        local_f8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
        [1] = 0.0;
        local_f8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
        [2] = 0.0;
        local_f8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
        [5] = 1.0;
        local_f8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
        [8] = 0.0;
        local_f8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
        [9] = 0.0;
        local_f8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
        [6] = 0.0;
        local_f8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
        [7] = 0.0;
        local_f8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
        [10] = 1.0;
        local_f8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
        [0xd] = 0.0;
        local_f8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
        [0xe] = 0.0;
        local_f8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
        [0xb] = 0.0;
        local_f8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
        [0xc] = 0.0;
        local_f8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
        [0xf] = 1.0;
        lVar5 = 0x10;
        puVar7 = local_68;
        do {
          uVar2 = puVar7[-1];
          *(undefined8 *)((long)local_108 + lVar5) = puVar7[-2];
          *(undefined8 *)
           ((long)local_f8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                  m_data.array + lVar5 + -8) = uVar2;
          *(undefined8 *)
           ((long)local_f8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                  m_data.array + lVar5) = *puVar7;
          puVar7 = puVar7 + 3;
          lVar5 = lVar5 + 0x20;
        } while (lVar5 != 0x70);
        local_f8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
        [0xc] = local_198;
        local_f8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
        [0xd] = dStack_190;
        local_f8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
        [0xe] = local_188;
        if ((char)local_2dc != '\0') {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"[VERBOSE] Matrix [V,v;0,0,0,1]",0x1e);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
          std::ostream::put('x');
          poVar6 = (ostream *)std::ostream::flush();
          poVar6 = Eigen::operator<<(poVar6,(DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)
                                            &local_f8);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
          std::ostream::put((char)poVar6);
          std::ostream::flush();
          if ((char)local_2dc != '\0') {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"[VERBOSE] inv(T)*T = eye(3)",0x1b);
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
            std::ostream::put('x');
            poVar6 = (ostream *)std::ostream::flush();
            local_318.m_xpr = (Matrix<double,_3,_3,_0,_3,_3> *)&local_f8;
            local_318.m_row = (Index)&local_f8;
            poVar6 = Eigen::operator<<(poVar6,(DenseBase<Eigen::Product<Eigen::Inverse<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>_>
                                               *)&local_318);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
            std::ostream::put((char)poVar6);
            std::ostream::flush();
          }
        }
        iVar1._M_current =
             (__return_storage_ptr__->
             super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        if (iVar1._M_current ==
            (__return_storage_ptr__->
            super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<Eigen::Matrix<double,4,4,0,4,4>,std::allocator<Eigen::Matrix<double,4,4,0,4,4>>>::
          _M_realloc_insert<Eigen::Matrix<double,4,4,0,4,4>const&>
                    ((vector<Eigen::Matrix<double,4,4,0,4,4>,std::allocator<Eigen::Matrix<double,4,4,0,4,4>>>
                      *)__return_storage_ptr__,iVar1,&local_f8);
        }
        else {
          pMVar8 = &local_f8;
          iVar9._M_current = iVar1._M_current;
          for (lVar5 = 0x10; lVar5 != 0; lVar5 = lVar5 + -1) {
            ((iVar9._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).
            m_storage.m_data.array[0] =
                 (pMVar8->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
                 m_data.array[0];
            pMVar8 = (Matrix<double,_4,_4,_0,_4,_4> *)((long)pMVar8 + ((ulong)bVar10 * -2 + 1) * 8);
            iVar9._M_current =
                 (Matrix<double,_4,_4,_0,_4,_4> *)
                 ((long)iVar9._M_current + ((ulong)bVar10 * -2 + 1) * 8);
          }
          (__return_storage_ptr__->
          super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
          )._M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
        }
        return __return_storage_ptr__;
      }
    }
    __function = 
    "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, 3, 1>>::finished() [MatrixType = Eigen::Matrix<double, 3, 1>]"
    ;
  }
  else {
LAB_0014b3f6:
    __function = 
    "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, 3, 3>>::finished() [MatrixType = Eigen::Matrix<double, 3, 3>]"
    ;
  }
  __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x7c,__function);
}

Assistant:

vector<Matrix<floatPrec, 4, 4>> getPredefinedTransformations2Plane1Line(
	Matrix<floatPrec, 4, 1> Pi1, Matrix<floatPrec, 4, 1> Pi2,
	Matrix<floatPrec, 4, 1> Nu1, Matrix<floatPrec, 4, 1> Nu2,
	bool verbose)
{

	vector<Matrix<floatPrec, 4, 4>> outTrans;
	Matrix<floatPrec, 4, 4> auxTrans;
	Matrix<floatPrec, 3, 3> auxRot;
	Matrix<floatPrec, 3, 1> auxT;

	floatPrec pi11, pi12, pi13, pi14;
	floatPrec pi21, pi22, pi23, pi24;
	floatPrec nu11, nu12, nu13, nu14;
	floatPrec nu21, nu22, nu23, nu24;

	pi11 = Pi1(0);
	pi12 = Pi1(1);
	pi13 = Pi1(2);
	pi14 = Pi1(3);
	pi21 = Pi2(0);
	pi22 = Pi2(1);
	pi23 = Pi2(2);
	pi24 = Pi2(3);
	nu11 = Nu1(0);
	nu12 = Nu1(1);
	nu13 = Nu1(2);
	nu14 = Nu1(3);
	nu21 = Nu2(0);
	nu22 = Nu2(1);
	nu23 = Nu2(2);
	nu24 = Nu2(3);

	// Compute U Matrix
	auxRot << 1.0 / sqrt((pi12 * pi12 + pi13 * pi13) * pow((pi12 * pi12) * pi21 + (pi13 * pi13) * pi21 - pi11 * pi12 * pi22 - pi11 * pi13 * pi23, 2.0) + pow(pi12 * pi23 - pi13 * pi22, 2.0) * (pi12 * pi12 + pi13 * pi13) * (pi11 * pi11 + pi12 * pi12 + pi13 * pi13)) * (pi12 * pi23 - pi13 * pi22) * (pi12 * pi12 + pi13 * pi13),
		-1.0 / sqrt((pi12 * pi12 + pi13 * pi13) * pow((pi12 * pi12) * pi21 + (pi13 * pi13) * pi21 - pi11 * pi12 * pi22 - pi11 * pi13 * pi23, 2.0) + pow(pi12 * pi23 - pi13 * pi22, 2.0) * (pi12 * pi12 + pi13 * pi13) * (pi11 * pi11 + pi12 * pi12 + pi13 * pi13)) * (pi11 * pi23 - pi13 * pi21) * (pi12 * pi12 + pi13 * pi13),
		1.0 / sqrt((pi12 * pi12 + pi13 * pi13) * pow((pi12 * pi12) * pi21 + (pi13 * pi13) * pi21 - pi11 * pi12 * pi22 - pi11 * pi13 * pi23, 2.0) + pow(pi12 * pi23 - pi13 * pi22, 2.0) * (pi12 * pi12 + pi13 * pi13) * (pi11 * pi11 + pi12 * pi12 + pi13 * pi13)) * (pi11 * pi22 - pi12 * pi21) * (pi12 * pi12 + pi13 * pi13),
		-1.0 / sqrt((pi12 * pi12 + pi13 * pi13) * pow((pi12 * pi12) * pi21 + (pi13 * pi13) * pi21 - pi11 * pi12 * pi22 - pi11 * pi13 * pi23, 2.0) + pow(pi12 * pi23 - pi13 * pi22, 2.0) * (pi12 * pi12 + pi13 * pi13) * (pi11 * pi11 + pi12 * pi12 + pi13 * pi13)) * (pi12 * pi12 + pi13 * pi13) * 1.0 / sqrt(pi11 * pi11 + pi12 * pi12 + pi13 * pi13) * ((pi12 * pi12) * pi21 + (pi13 * pi13) * pi21 - pi11 * pi12 * pi22 - pi11 * pi13 * pi23),
		-1.0 / sqrt((pi12 * pi12 + pi13 * pi13) * pow((pi12 * pi12) * pi21 + (pi13 * pi13) * pi21 - pi11 * pi12 * pi22 - pi11 * pi13 * pi23, 2.0) + pow(pi12 * pi23 - pi13 * pi22, 2.0) * (pi12 * pi12 + pi13 * pi13) * (pi11 * pi11 + pi12 * pi12 + pi13 * pi13)) * (pi12 * pi12 + pi13 * pi13) * 1.0 / sqrt(pi11 * pi11 + pi12 * pi12 + pi13 * pi13) * ((pi11 * pi11) * pi22 + (pi13 * pi13) * pi22 - pi11 * pi12 * pi21 - pi12 * pi13 * pi23),
		-1.0 / sqrt((pi12 * pi12 + pi13 * pi13) * pow((pi12 * pi12) * pi21 + (pi13 * pi13) * pi21 - pi11 * pi12 * pi22 - pi11 * pi13 * pi23, 2.0) + pow(pi12 * pi23 - pi13 * pi22, 2.0) * (pi12 * pi12 + pi13 * pi13) * (pi11 * pi11 + pi12 * pi12 + pi13 * pi13)) * (pi12 * pi12 + pi13 * pi13) * 1.0 / sqrt(pi11 * pi11 + pi12 * pi12 + pi13 * pi13) * ((pi11 * pi11) * pi23 + (pi12 * pi12) * pi23 - pi11 * pi13 * pi21 - pi12 * pi13 * pi22),
		pi11 * 1.0 / sqrt(pi11 * pi11 + pi12 * pi12 + pi13 * pi13),
		pi12 * 1.0 / sqrt(pi11 * pi11 + pi12 * pi12 + pi13 * pi13),
		pi13 * 1.0 / sqrt(pi11 * pi11 + pi12 * pi12 + pi13 * pi13);

	// Compute u vector
	auxT << 0.0,
		-1.0 / sqrt(pi11 * pi11 + pi12 * pi12 + pi13 * pi13) * ((pi11 * pi11) * pi24 + (pi12 * pi12) * pi24 + (pi13 * pi13) * pi24 - pi11 * pi14 * pi21 - pi12 * pi14 * pi22 - pi13 * pi14 * pi23) * 1.0 / sqrt((pi11 * pi11) * (pi22 * pi22) + (pi12 * pi12) * (pi21 * pi21) + (pi11 * pi11) * (pi23 * pi23) + (pi13 * pi13) * (pi21 * pi21) + (pi12 * pi12) * (pi23 * pi23) + (pi13 * pi13) * (pi22 * pi22) - pi11 * pi12 * pi21 * pi22 * 2.0 - pi11 * pi13 * pi21 * pi23 * 2.0 - pi12 * pi13 * pi22 * pi23 * 2.0),
		pi14 * 1.0 / sqrt(pi11 * pi11 + pi12 * pi12 + pi13 * pi13);

	auxTrans = Matrix<floatPrec, 4, 4>::Identity(4, 4);
	auxTrans.topLeftCorner(3, 3) = auxRot;
	auxTrans.topRightCorner(3, 1) = auxT;

	if (verbose)
		cout << "[VERBOSE] Matrix [U,u;0,0,0,1]" << endl
			 << auxTrans << endl;
	if (verbose)
		cout << "[VERBOSE] inv(T)*T = eye(3)" << endl
			 << auxTrans.inverse() * auxTrans << endl;

	// add U,u to the output vector
	outTrans.push_back(auxTrans);

	// Compute V Matrix
	auxRot << 1.0 / sqrt((nu12 * nu12 + nu13 * nu13) * pow((nu12 * nu12) * nu21 + (nu13 * nu13) * nu21 - nu11 * nu12 * nu22 - nu11 * nu13 * nu23, 2.0) + pow(nu12 * nu23 - nu13 * nu22, 2.0) * (nu12 * nu12 + nu13 * nu13) * (nu11 * nu11 + nu12 * nu12 + nu13 * nu13)) * (nu12 * nu23 - nu13 * nu22) * (nu12 * nu12 + nu13 * nu13),
		-1.0 / sqrt((nu12 * nu12 + nu13 * nu13) * pow((nu12 * nu12) * nu21 + (nu13 * nu13) * nu21 - nu11 * nu12 * nu22 - nu11 * nu13 * nu23, 2.0) + pow(nu12 * nu23 - nu13 * nu22, 2.0) * (nu12 * nu12 + nu13 * nu13) * (nu11 * nu11 + nu12 * nu12 + nu13 * nu13)) * (nu11 * nu23 - nu13 * nu21) * (nu12 * nu12 + nu13 * nu13),
		1.0 / sqrt((nu12 * nu12 + nu13 * nu13) * pow((nu12 * nu12) * nu21 + (nu13 * nu13) * nu21 - nu11 * nu12 * nu22 - nu11 * nu13 * nu23, 2.0) + pow(nu12 * nu23 - nu13 * nu22, 2.0) * (nu12 * nu12 + nu13 * nu13) * (nu11 * nu11 + nu12 * nu12 + nu13 * nu13)) * (nu11 * nu22 - nu12 * nu21) * (nu12 * nu12 + nu13 * nu13),
		-1.0 / sqrt((nu12 * nu12 + nu13 * nu13) * pow((nu12 * nu12) * nu21 + (nu13 * nu13) * nu21 - nu11 * nu12 * nu22 - nu11 * nu13 * nu23, 2.0) + pow(nu12 * nu23 - nu13 * nu22, 2.0) * (nu12 * nu12 + nu13 * nu13) * (nu11 * nu11 + nu12 * nu12 + nu13 * nu13)) * (nu12 * nu12 + nu13 * nu13) * 1.0 / sqrt(nu11 * nu11 + nu12 * nu12 + nu13 * nu13) * ((nu12 * nu12) * nu21 + (nu13 * nu13) * nu21 - nu11 * nu12 * nu22 - nu11 * nu13 * nu23),
		-1.0 / sqrt((nu12 * nu12 + nu13 * nu13) * pow((nu12 * nu12) * nu21 + (nu13 * nu13) * nu21 - nu11 * nu12 * nu22 - nu11 * nu13 * nu23, 2.0) + pow(nu12 * nu23 - nu13 * nu22, 2.0) * (nu12 * nu12 + nu13 * nu13) * (nu11 * nu11 + nu12 * nu12 + nu13 * nu13)) * (nu12 * nu12 + nu13 * nu13) * 1.0 / sqrt(nu11 * nu11 + nu12 * nu12 + nu13 * nu13) * ((nu11 * nu11) * nu22 + (nu13 * nu13) * nu22 - nu11 * nu12 * nu21 - nu12 * nu13 * nu23),
		-1.0 / sqrt((nu12 * nu12 + nu13 * nu13) * pow((nu12 * nu12) * nu21 + (nu13 * nu13) * nu21 - nu11 * nu12 * nu22 - nu11 * nu13 * nu23, 2.0) + pow(nu12 * nu23 - nu13 * nu22, 2.0) * (nu12 * nu12 + nu13 * nu13) * (nu11 * nu11 + nu12 * nu12 + nu13 * nu13)) * (nu12 * nu12 + nu13 * nu13) * 1.0 / sqrt(nu11 * nu11 + nu12 * nu12 + nu13 * nu13) * ((nu11 * nu11) * nu23 + (nu12 * nu12) * nu23 - nu11 * nu13 * nu21 - nu12 * nu13 * nu22),
		nu11 * 1.0 / sqrt(nu11 * nu11 + nu12 * nu12 + nu13 * nu13),
		nu12 * 1.0 / sqrt(nu11 * nu11 + nu12 * nu12 + nu13 * nu13),
		nu13 * 1.0 / sqrt(nu11 * nu11 + nu12 * nu12 + nu13 * nu13);

	// Compute v vector
	auxT << 0.0,
		-1.0 / sqrt(nu11 * nu11 + nu12 * nu12 + nu13 * nu13) * ((nu11 * nu11) * nu24 + (nu12 * nu12) * nu24 + (nu13 * nu13) * nu24 - nu11 * nu14 * nu21 - nu12 * nu14 * nu22 - nu13 * nu14 * nu23) * 1.0 / sqrt((nu11 * nu11) * (nu22 * nu22) + (nu12 * nu12) * (nu21 * nu21) + (nu11 * nu11) * (nu23 * nu23) + (nu13 * nu13) * (nu21 * nu21) + (nu12 * nu12) * (nu23 * nu23) + (nu13 * nu13) * (nu22 * nu22) - nu11 * nu12 * nu21 * nu22 * 2.0 - nu11 * nu13 * nu21 * nu23 * 2.0 - nu12 * nu13 * nu22 * nu23 * 2.0),
		nu14 * 1.0 / sqrt(nu11 * nu11 + nu12 * nu12 + nu13 * nu13);

	auxTrans = Matrix<floatPrec, 4, 4>::Identity(4, 4);
	auxTrans.topLeftCorner(3, 3) = auxRot;
	auxTrans.topRightCorner(3, 1) = auxT;

	if (verbose)
		cout << "[VERBOSE] Matrix [V,v;0,0,0,1]" << endl
			 << auxTrans << endl;
	if (verbose)
		cout << "[VERBOSE] inv(T)*T = eye(3)" << endl
			 << auxTrans.inverse() * auxTrans << endl;

	// add V,v to the output vector
	outTrans.push_back(auxTrans);

	return outTrans;
}